

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *pcVar3;
  Snapshot snapshot;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  bool bVar4;
  char *pcVar5;
  cmLocalGenerator *pcVar6;
  size_t sVar7;
  bool collapse;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar8;
  bool collapse_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  string file;
  string homeOutputDir;
  string homeDir;
  string local_d8;
  cmGlobalGenerator *local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  Snapshot local_48;
  
  pcVar2 = this->GlobalGenerator;
  local_b8 = pcVar2;
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
    local_b8 = (cmGlobalGenerator *)operator_new(0x5c8);
    cmGlobalGenerator::cmGlobalGenerator(local_b8,this);
  }
  if (path != (char *)0x0) {
    cmState::Reset((Snapshot *)local_68,this->State);
    (this->CurrentSnapshot).Position.Position = local_68._16_8_;
    (this->CurrentSnapshot).State = (cmState *)local_68._0_8_;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmState::SnapshotDataType> *)local_68._8_8_;
    pcVar5 = cmState::GetSourceDirectory(this->State);
    std::__cxx11::string::string((string *)local_68,pcVar5,(allocator *)&local_88);
    pcVar5 = cmState::GetBinaryDirectory(this->State);
    std::__cxx11::string::string((string *)&local_88,pcVar5,(allocator *)&local_d8);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_d8,(SystemTools *)0x1,collapse)
    ;
    cmState::SetSourceDirectory(this->State,&local_d8);
    paVar1 = &local_d8.field_2;
    uVar8 = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      uVar8 = extraout_DL_00;
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_d8,(SystemTools *)0x1,(bool)uVar8);
    cmState::SetBinaryDirectory(this->State,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    local_b0 = args;
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    pcVar6 = cmGlobalGenerator::MakeLocalGenerator(local_b8,snapshot,(cmLocalGenerator *)0x0);
    pcVar3 = pcVar6->Makefile;
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_d8,(SystemTools *)0x1,collapse_00);
    cmMakefile::SetCurrentBinaryDirectory(pcVar3,&local_d8);
    uVar8 = extraout_DL_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      uVar8 = extraout_DL_02;
    }
    pcVar3 = pcVar6->Makefile;
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_d8,(SystemTools *)0x1,(bool)uVar8);
    cmMakefile::SetCurrentSourceDirectory(pcVar3,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      sVar7 = strlen(path);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,path,path + sVar7);
      cmsys::SystemTools::CollapseFullPath(&local_d8,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(&local_d8);
      args_00 = local_b0;
      cmMakefile::SetScriptModeFile(pcVar6->Makefile,local_d8._M_dataplus._M_p);
      cmMakefile::SetArgcArgv(pcVar6->Makefile,args_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar4 = cmMakefile::ReadListFile(pcVar6->Makefile,path);
    if (!bVar4) {
      cmSystemTools::Error("Error processing file: ",path,(char *)0x0,(char *)0x0);
    }
    cmState::SetSourceDirectory(this->State,(string *)local_68);
    cmState::SetBinaryDirectory(this->State,&local_88);
    (*pcVar6->_vptr_cmLocalGenerator[1])(pcVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((cmState *)local_68._0_8_ != (cmState *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
    (*local_b8->_vptr_cmGlobalGenerator[1])();
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const char *path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg)
    {
    gg = new cmGlobalGenerator(this);
    created = true;
    }

  // read in the list file to fill the cache
  if(path)
    {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmsys::auto_ptr<cmLocalGenerator> lg(gg->MakeLocalGenerator());
    lg->GetMakefile()->SetCurrentBinaryDirectory
      (cmSystemTools::GetCurrentWorkingDirectory());
    lg->GetMakefile()->SetCurrentSourceDirectory
      (cmSystemTools::GetCurrentWorkingDirectory());
    if (this->GetWorkingMode() != NORMAL_MODE)
      {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      lg->GetMakefile()->SetScriptModeFile(file.c_str());

      lg->GetMakefile()->SetArgcArgv(args);
      }
    if (!lg->GetMakefile()->ReadListFile(path))
      {
      cmSystemTools::Error("Error processing file: ", path);
      }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
    }

  // free generic one if generated
  if (created)
    {
    delete gg;
    }
}